

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

bool __thiscall
AmpIO::ReadDoutControl(AmpIO *this,uint index,uint16_t *countsHigh,uint16_t *countsLow)

{
  BasePort *pBVar1;
  uint32_t uVar2;
  int iVar3;
  undefined8 in_RAX;
  long lVar4;
  char *pcVar5;
  uint32_t read_data;
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  *countsHigh = 0;
  *countsLow = 0;
  uVar2 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar2 < 5) {
    pcVar5 = "AmpIO::ReadDoutControl: requires firmware 5 or above";
    lVar4 = 0x34;
  }
  else {
    uVar2 = BoardIO::GetHardwareVersion((BoardIO *)this);
    if (uVar2 != 0x64524131) {
      pBVar1 = (this->super_FpgaIO).super_BoardIO.port;
      if (pBVar1 == (BasePort *)0x0) {
        return false;
      }
      if (index < this->NumDouts) {
        iVar3 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_FpgaIO).super_BoardIO.BoardId,
                           (ulong)(index * 0x10 + 0x18),&local_24);
        if ((char)iVar3 == '\0') {
          return false;
        }
        *countsLow = (uint16_t)((uint)local_24 >> 0x10);
        *countsHigh = (uint16_t)local_24;
        return true;
      }
      return false;
    }
    pcVar5 = "AmpIO::ReadDoutControl not implemented for dRAC";
    lVar4 = 0x2f;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar4);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
  std::ostream::put('\x10');
  std::ostream::flush();
  return false;
}

Assistant:

bool AmpIO::ReadDoutControl(unsigned int index, uint16_t &countsHigh, uint16_t &countsLow)
{
    countsHigh = 0;
    countsLow = 0;
    if (GetFirmwareVersion() < 5) {
        std::cerr << "AmpIO::ReadDoutControl: requires firmware 5 or above" << std::endl;
        return false;
    }
    if (GetHardwareVersion() == dRA1_String) {
        std::cerr << "AmpIO::ReadDoutControl not implemented for dRAC" << std::endl;
        return false;
    }

    uint32_t read_data;
    unsigned int channel = (index+1) << 4;
    if (port && (index < NumDouts)) {
        if (port->ReadQuadlet(BoardId, channel | DOUT_CTRL_REG, read_data)) {
            // Starting with Version 1.3.0 of this library, we swap the high and low times
            // because the digital outputs are inverted in hardware.
            countsLow = static_cast<uint16_t>(read_data >> 16);
            countsHigh  = static_cast<uint16_t>(read_data);
            return true;
        }
    }
    return false;
}